

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_hatch.cpp
# Opt level: O1

void __thiscall ON_HatchLine::Dump(ON_HatchLine *this,ON_TextLog *dump)

{
  uint uVar1;
  long lVar2;
  long lVar3;
  double dVar4;
  double dVar5;
  
  dVar4 = this->m_angle_radians;
  dVar5 = dVar4;
  if ((0.0 <= dVar4) && (dVar4 < 6.283185307179586)) {
    dVar5 = (double)(-(ulong)(dVar4 * 57.29577951308232 < 360.0) &
                    (ulong)(dVar4 * 57.29577951308232));
  }
  ON_TextLog::Print(dump,"ON_HatchLine: angle = %lf radians ( %lf degrees) ",dVar4,dVar5);
  ON_TextLog::Print(dump," base = ");
  ON_TextLog::Print(dump,&this->m_base);
  ON_TextLog::Print(dump," offset = ");
  ON_TextLog::Print(dump,&this->m_offset);
  uVar1 = (this->m_dashes).m_count;
  lVar3 = (long)(int)uVar1;
  ON_TextLog::Print(dump,"\nDash count = %d: ",(ulong)uVar1);
  if (0 < lVar3) {
    lVar2 = 0;
    do {
      dVar4 = 0.0;
      if (lVar2 < (this->m_dashes).m_count) {
        dVar4 = (this->m_dashes).m_a[lVar2];
      }
      ON_TextLog::Print(dump,"%lf",dVar4);
      if (lVar2 < lVar3 + -1) {
        ON_TextLog::Print(dump,", ");
      }
      lVar2 = lVar2 + 1;
    } while (lVar3 != lVar2);
  }
  ON_TextLog::Print(dump,"\n");
  return;
}

Assistant:

void ON_HatchLine::Dump( ON_TextLog& dump) const
{
  dump.Print( "ON_HatchLine: angle = %lf radians ( %lf degrees) ", 
    AngleRadians(), AngleDegrees());
  dump.Print( " base = ");
  dump.Print( m_base);
  dump.Print( " offset = ");
  dump.Print( m_offset);
  int count = m_dashes.Count();
  dump.Print( "\nDash count = %d: ", count);
  for( int i = 0; i < count; i++)
  {
    dump.Print( "%lf", Dash( i));
    if( i < count-1)
      dump.Print( ", ");
  }
  dump.Print( "\n");
}